

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem1.cpp
# Opt level: O3

bool binSearch(int *arr,int size,int key)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)size;
  piVar1 = arr + uVar6;
  if (size != 0) {
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (arr,piVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(arr,piVar1);
    if (0 < size) {
      do {
        uVar4 = uVar6 >> 1;
        uVar5 = ~uVar4 + uVar6;
        uVar6 = uVar4;
        if (arr[uVar4] < key) {
          arr = arr + uVar4 + 1;
          uVar6 = uVar5;
        }
      } while (0 < (long)uVar6);
    }
  }
  if (arr == piVar1) {
    bVar3 = false;
  }
  else {
    bVar3 = *arr <= key;
  }
  return bVar3;
}

Assistant:

bool binSearch(int arr[],int size,int key){ sort(arr, arr+size); return binary_search(arr, arr+size, key); }